

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

void OpenMesh::IO::assignCustomProperty<float>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar2;
  float local_38;
  value_type local_34;
  value_type local_30;
  float in;
  VPropHandleT<float> prop;
  
  in = -NAN;
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  local_38 = 0.0;
  in = (float)PropertyContainer::handle<float>
                        ((PropertyContainer *)(CONCAT44(extraout_var,iVar1) + 8),&local_38,_propName
                        );
  if (in == -NAN) {
    iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<float>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar1),(VPropHandleT<float> *)&in,_propName);
  }
  std::istream::_M_extract<float>((float *)_in);
  local_30 = local_34;
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar2 = BaseKernel::property<float>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar1),(VPropHandleT<float>)in,_vh);
  *pvVar2 = local_30;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}